

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stunmsgpp_unittest.cc
# Opt level: O2

void anon_unknown.dwarf_19b63::PrintWord(uint8_t *v,size_t size,ostream *out)

{
  long lVar1;
  ostream *this;
  size_t sVar2;
  
  for (sVar2 = 0; size != sVar2; sVar2 = sVar2 + 1) {
    if (sVar2 != 0) {
      std::operator<<(out," ");
    }
    this = std::operator<<(out,0x30);
    lVar1 = *(long *)this;
    *(undefined8 *)(this + *(long *)(lVar1 + -0x18) + 0x10) = 2;
    lVar1 = *(long *)(lVar1 + -0x18);
    *(uint *)(this + lVar1 + 0x18) = *(uint *)(this + lVar1 + 0x18) & 0xffffffb5 | 8;
    std::ostream::operator<<(this,(uint)v[sVar2]);
  }
  return;
}

Assistant:

void PrintWord(const uint8_t *v, size_t size, std::ostream &out) {
  size_t i;
  for (i = 0; i < size; i++) {
    if (i > 0)
      out << " ";
    out << std::setfill('0')
        << std::setw(2)
        << std::hex
        << (int)v[i];
  }
}